

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * wasm::operator<<(ostream *os,Array *array)

{
  ostream *poVar1;
  ulong extraout_RDX;
  optional<wasm::HeapType> super;
  TypePrinter local_98;
  
  anon_unknown_0::TypePrinter::TypePrinter(&local_98,os);
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
  super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)extraout_RDX;
  poVar1 = anon_unknown_0::TypePrinter::print(&local_98,array,super);
  anon_unknown_0::TypePrinter::~TypePrinter(&local_98);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Array array) {
  return TypePrinter(os).print(array);
}